

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnd.h
# Opt level: O1

int rnd_pcg_range(rnd_pcg_t *pcg,int min,int max)

{
  ulong uVar1;
  byte bVar2;
  uint uVar3;
  
  if (-1 < max - min) {
    uVar1 = pcg->state[0];
    uVar3 = (uint)(uVar1 >> 0x2d) ^ (uint)(uVar1 >> 0x1b);
    bVar2 = (byte)(uVar1 >> 0x3b);
    pcg->state[0] = uVar1 * 0x5851f42d4c957f2d + pcg->state[1];
    min = min + (int)((float)((max - min) + 1) *
                     ((float)((uVar3 >> bVar2 | uVar3 << 0x20 - bVar2) >> 9 | 0x3f800000) + -1.0));
  }
  return min;
}

Assistant:

int rnd_pcg_range( rnd_pcg_t* pcg, int min, int max )
    {
    int const range = ( max - min ) + 1;
    if( range <= 0 ) return min;
    int const value = (int) ( rnd_pcg_nextf( pcg ) * range );
    return min + value; 
    }